

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content-parser.c
# Opt level: O2

_Bool blogc_is_ordered_list_item(char *str,size_t prefix_len)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  char cVar5;
  
  if (str == (char *)0x0) {
    return false;
  }
  sVar2 = strlen(str);
  if (1 < sVar2) {
    uVar3 = 0;
    do {
      pcVar1 = str + uVar3;
      uVar3 = uVar3 + 1;
    } while ((byte)(*pcVar1 - 0x30U) < 10);
    if (*pcVar1 == '.' && uVar3 != 1) {
      uVar4 = uVar3;
      if (uVar3 < prefix_len) {
        uVar4 = prefix_len;
      }
      for (; uVar3 < prefix_len; uVar3 = uVar3 + 1) {
        cVar5 = str[uVar3];
        if ((cVar5 != ' ') && (cVar5 != '\t')) goto LAB_0010675a;
      }
      cVar5 = str[uVar4];
      uVar3 = uVar4;
LAB_0010675a:
      return uVar3 == prefix_len && cVar5 != '\0';
    }
  }
  return false;
}

Assistant:

bool
blogc_is_ordered_list_item(const char *str, size_t prefix_len)
{
    if (str == NULL)
        return false;

    if (strlen(str) < 2)
        return false;

    size_t i;

    for (i = 0; str[i] >= '0' && str[i] <= '9'; i++);

    if (i == 0)
        return false;
    if (str[i] != '.')
        return false;

    for (i++; i < prefix_len && (str[i] == ' ' || str[i] == '\t'); i++);

    if (str[i] == '\0')
        return false;

    return i == prefix_len;
}